

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O3

string * __thiscall
ApprovalTests::TestName::findFileName(string *__return_storage_ptr__,TestName *this,string *file)

{
  string newFileName;
  string local_30;
  
  checkParentDirectoriesForFile(&local_30,file);
  SystemUtils::checkFilenameCase(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestName::findFileName(const std::string& file)
    {
        auto newFileName = checkParentDirectoriesForFile(file);
        return SystemUtils::checkFilenameCase(newFileName);
    }